

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall Preprocessor::~Preprocessor(Preprocessor *this)

{
  std::__cxx11::string::~string((string *)&this->d_B_path);
  std::__cxx11::string::~string((string *)&this->d_A_path);
  std::__cxx11::string::~string((string *)&this->d_path);
  std::__cxx11::string::~string((string *)&this->p_B_path);
  std::__cxx11::string::~string((string *)&this->p_A_path);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Preprocessor::~Preprocessor()
{
}